

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_saveg.cpp
# Opt level: O0

FSerializer * Serialize(FSerializer *arc,char *key,subsector_t **ss,subsector_t **param_4)

{
  byte bVar1;
  bool bVar2;
  bool bVar3;
  byte *pbVar4;
  char *pcVar5;
  FSerializer *pFVar6;
  size_t index;
  int local_7c;
  int local_78;
  int s;
  int i_1;
  int sub;
  int iStack_68;
  bool success;
  int num_subs;
  int num_verts;
  int local_54;
  int local_50;
  int j;
  int i;
  int p;
  TArray<char,_char> encoded;
  char *str;
  BYTE by;
  subsector_t **param_3_local;
  subsector_t **ss_local;
  char *key_local;
  FSerializer *arc_local;
  
  bVar2 = FSerializer::isWriting(arc);
  if (bVar2) {
    if ((hasglnodes & 1U) != 0) {
      TArray<char,_char>::TArray((TArray<char,_char> *)&i,(numsubsectors + 5) / 6 + 1);
      j = 0;
      for (local_50 = 0; local_50 < numsubsectors; local_50 = local_50 + 6) {
        str._7_1_ = 0;
        for (local_54 = 0; local_54 < 6; local_54 = local_54 + 1) {
          if ((local_50 + local_54 < numsubsectors) &&
             ((subsectors[local_50 + local_54].flags & 2U) != 0)) {
            str._7_1_ = str._7_1_ | (byte)(1 << ((byte)local_54 & 0x1f));
          }
        }
        if (str._7_1_ < 10) {
          str._7_1_ = str._7_1_ + 0x30;
        }
        else if (str._7_1_ < 0x24) {
          str._7_1_ = str._7_1_ + 0x37;
        }
        else if (str._7_1_ < 0x3e) {
          str._7_1_ = str._7_1_ + 0x3d;
        }
        else if (str._7_1_ == 0x3e) {
          str._7_1_ = 0x2d;
        }
        else if (str._7_1_ == 0x3f) {
          str._7_1_ = 0x2b;
        }
        index = (size_t)j;
        j = j + 1;
        pbVar4 = (byte *)TArray<char,_char>::operator[]((TArray<char,_char> *)&i,index);
        *pbVar4 = str._7_1_;
      }
      pcVar5 = TArray<char,_char>::operator[]((TArray<char,_char> *)&i,(long)j);
      *pcVar5 = '\0';
      encoded._8_8_ = TArray<char,_char>::operator[]((TArray<char,_char> *)&i,0);
      bVar2 = FSerializer::BeginArray(arc,key);
      if (bVar2) {
        pFVar6 = FSerializer::operator()(arc,(char *)0x0,&numvertexes);
        pFVar6 = FSerializer::operator()(pFVar6,(char *)0x0,&numsubsectors);
        pFVar6 = FSerializer::StringPtr(pFVar6,(char *)0x0,(char **)&encoded.Most);
        FSerializer::EndArray(pFVar6);
      }
      TArray<char,_char>::~TArray((TArray<char,_char> *)&i);
    }
  }
  else {
    bVar2 = false;
    bVar3 = FSerializer::BeginArray(arc,key);
    if (bVar3) {
      pFVar6 = FSerializer::operator()(arc,(char *)0x0,&stack0xffffffffffffff98);
      pFVar6 = FSerializer::operator()(pFVar6,(char *)0x0,&sub);
      pFVar6 = FSerializer::StringPtr(pFVar6,(char *)0x0,(char **)&encoded.Most);
      FSerializer::EndArray(pFVar6);
      if (((iStack_68 == numvertexes) && (sub == numsubsectors)) && ((hasglnodes & 1U) != 0)) {
        bVar2 = true;
        s = 0;
        for (local_78 = 0; *(char *)(encoded._8_8_ + (long)local_78) != '\0';
            local_78 = local_78 + 1) {
          bVar1 = *(byte *)(encoded._8_8_ + (long)local_78);
          if ((bVar1 < 0x30) || (0x39 < bVar1)) {
            if ((bVar1 < 0x41) || (0x5a < bVar1)) {
              if ((bVar1 < 0x61) || (0x7a < bVar1)) {
                if (bVar1 == 0x2d) {
                  str._7_1_ = 0x3e;
                }
                else {
                  if (bVar1 != 0x2b) {
                    bVar2 = false;
                    break;
                  }
                  str._7_1_ = 0x3f;
                }
              }
              else {
                str._7_1_ = bVar1 - 0x3d;
              }
            }
            else {
              str._7_1_ = bVar1 - 0x37;
            }
          }
          else {
            str._7_1_ = bVar1 - 0x30;
          }
          for (local_7c = 0; local_7c < 6; local_7c = local_7c + 1) {
            if ((s + local_7c < numsubsectors) &&
               (((uint)str._7_1_ & 1 << ((byte)local_7c & 0x1f)) != 0)) {
              subsectors[s + local_7c].flags = subsectors[s + local_7c].flags | 2;
            }
          }
          s = s + 6;
        }
      }
      if (((hasglnodes & 1U) != 0) && (!bVar2)) {
        RecalculateDrawnSubsectors();
      }
    }
  }
  return arc;
}

Assistant:

FSerializer &Serialize(FSerializer &arc, const char *key, subsector_t *&ss, subsector_t **)
{
	BYTE by;
	const char *str;

	if (arc.isWriting())
	{
		if (hasglnodes)
		{
			TArray<char> encoded(1 + (numsubsectors + 5) / 6);
			int p = 0;
			for (int i = 0; i < numsubsectors; i += 6)
			{
				by = 0;
				for (int j = 0; j < 6; j++)
				{
					if (i + j < numsubsectors && (subsectors[i + j].flags & SSECF_DRAWN))
					{
						by |= (1 << j);
					}
				}
				if (by < 10) by += '0';
				else if (by < 36) by += 'A' - 10;
				else if (by < 62) by += 'a' - 36;
				else if (by == 62) by = '-';
				else if (by == 63) by = '+';
				encoded[p++] = by;
			}
			encoded[p] = 0;
			str = &encoded[0];
			if (arc.BeginArray(key))
			{
				arc(nullptr, numvertexes)
					(nullptr, numsubsectors)
					.StringPtr(nullptr, str)
					.EndArray();
			}
		}
	}
	else
	{
		int num_verts, num_subs;
		bool success = false;
		if (arc.BeginArray(key))
		{
			arc(nullptr, num_verts)
				(nullptr, num_subs)
				.StringPtr(nullptr, str)
				.EndArray();

			if (num_verts == numvertexes && num_subs == numsubsectors && hasglnodes)
			{
				success = true;
				int sub = 0;
				for (int i = 0; str[i] != 0; i++)
				{
					by = str[i];
					if (by >= '0' && by <= '9') by -= '0';
					else if (by >= 'A' && by <= 'Z') by -= 'A' - 10;
					else if (by >= 'a' && by <= 'z') by -= 'a' - 36;
					else if (by == '-') by = 62;
					else if (by == '+') by = 63;
					else
					{
						success = false;
						break;
					}
					for (int s = 0; s < 6; s++)
					{
						if (sub + s < numsubsectors && (by & (1 << s)))
						{
							subsectors[sub + s].flags |= SSECF_DRAWN;
						}
					}
					sub += 6;
				}
			}
			if (hasglnodes && !success)
			{
				RecalculateDrawnSubsectors();
			}
		}

	}
	return arc;
}